

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O2

SquareMatrix3<double> *
OpenMD::outProduct<double>
          (SquareMatrix3<double> *__return_storage_ptr__,Vector3<double> *v1,Vector3<double> *v2)

{
  double dVar1;
  uint i;
  long lVar2;
  double (*padVar3) [3];
  long lVar4;
  
  SquareMatrix<double,_3>::SquareMatrix(&__return_storage_ptr__->super_SquareMatrix<double,_3>);
  padVar3 = (double (*) [3])__return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    dVar1 = (v1->super_Vector<double,_3U>).data_[lVar2];
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      (((SquareMatrix<double,_3> *)*padVar3)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar4] =
           (v2->super_Vector<double,_3U>).data_[lVar4] * dVar1;
    }
    padVar3 = padVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline SquareMatrix3<Real> outProduct(const Vector3<Real>& v1,
                                        const Vector3<Real>& v2) {
    SquareMatrix3<Real> result;

    for (unsigned int i = 0; i < 3; i++) {
      for (unsigned int j = 0; j < 3; j++) {
        result(i, j) = v1[i] * v2[j];
      }
    }

    return result;
  }